

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  cmDocumentationSection *pcVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pcVar5;
  size_t sVar6;
  char *pcVar7;
  int local_70;
  int i;
  int align;
  __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
  local_60;
  const_iterator op;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *entries;
  string local_40;
  cmDocumentationSection *local_20;
  cmDocumentationSection *section_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  local_20 = section;
  section_local = (cmDocumentationSection *)os;
  os_local = (ostream *)this;
  cmDocumentationSection::GetName_abi_cxx11_(&local_40,section);
  poVar3 = std::operator<<(os,(string *)&local_40);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  op._M_current = (cmDocumentationEntry *)cmDocumentationSection::GetEntries(local_20);
  local_60._M_current =
       (cmDocumentationEntry *)
       std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::begin
                 ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                  op._M_current);
  while( true ) {
    _i = std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::end
                   (op._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
                        *)&i);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
    ::operator->(&local_60);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)section_local,"  ");
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
               ::operator->(&local_60);
      std::operator<<(poVar3,(string *)pcVar5);
      this->TextIndent = "                                 ";
      sVar6 = strlen(this->TextIndent);
      __gnu_cxx::
      __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
      ::operator->(&local_60);
      for (local_70 = std::__cxx11::string::size(); local_70 < (int)sVar6 + -4;
          local_70 = local_70 + 1) {
        std::operator<<((ostream *)section_local," ");
      }
      __gnu_cxx::
      __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
      ::operator->(&local_60);
      uVar4 = std::__cxx11::string::size();
      sVar6 = strlen(this->TextIndent);
      if (sVar6 - 4 < uVar4) {
        std::operator<<((ostream *)section_local,"\n");
        pcVar1 = section_local;
        pcVar7 = this->TextIndent;
        strlen(this->TextIndent);
        std::ostream::write((char *)pcVar1,(long)pcVar7);
      }
      std::operator<<((ostream *)section_local,"= ");
      pcVar1 = section_local;
      __gnu_cxx::
      __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
      ::operator->(&local_60);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      PrintColumn(this,(ostream *)pcVar1,pcVar7);
      std::operator<<((ostream *)section_local,"\n");
    }
    else {
      std::operator<<((ostream *)section_local,"\n");
      pcVar1 = section_local;
      this->TextIndent = "";
      __gnu_cxx::
      __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
      ::operator->(&local_60);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      PrintFormatted(this,(ostream *)pcVar1,pcVar7);
    }
    __gnu_cxx::
    __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
    ::operator++(&local_60);
  }
  std::operator<<((ostream *)section_local,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter
::PrintSection(std::ostream& os,
               cmDocumentationSection const& section)
{
  os << section.GetName() << "\n";

  const std::vector<cmDocumentationEntry> &entries =
    section.GetEntries();
  for(std::vector<cmDocumentationEntry>::const_iterator op = entries.begin();
      op != entries.end(); ++op)
    {
    if(!op->Name.empty())
      {
      os << "  " << op->Name;
      this->TextIndent = "                                 ";
      int align = static_cast<int>(strlen(this->TextIndent))-4;
      for(int i = static_cast<int>(op->Name.size()); i < align; ++i)
        {
        os << " ";
        }
      if (op->Name.size() > strlen(this->TextIndent)-4 )
        {
        os << "\n";
        os.write(this->TextIndent, strlen(this->TextIndent)-2);
        }
      os << "= ";
      this->PrintColumn(os, op->Brief.c_str());
      os << "\n";
      }
    else
      {
      os << "\n";
      this->TextIndent = "";
      this->PrintFormatted(os, op->Brief.c_str());
      }
    }
  os << "\n";
}